

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbeglintegration.cpp
# Opt level: O3

QPlatformOpenGLContext * __thiscall
QXcbEglIntegration::createPlatformOpenGLContext(QXcbEglIntegration *this,QOpenGLContext *context)

{
  QEGLPlatformContext *pQVar1;
  undefined8 uVar2;
  long in_FS_OFFSET;
  QSurfaceFormat aQStack_48 [8];
  QSurfaceFormat local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QOpenGLContext::screen();
  QScreen::handle();
  pQVar1 = (QEGLPlatformContext *)operator_new(0x78);
  QOpenGLContext::format();
  QXcbScreen::surfaceFormatFor(local_40);
  uVar2 = QOpenGLContext::shareHandle();
  QEGLPlatformContext::QEGLPlatformContext(pQVar1,local_40,uVar2,this->m_egl_display,0,0);
  *(undefined ***)pQVar1 = &PTR__QEGLPlatformContext_0010d230;
  *(undefined ***)(pQVar1 + 0x10) = &PTR__QXcbEglContext_0010d2e8;
  QSurfaceFormat::~QSurfaceFormat(local_40);
  QSurfaceFormat::~QSurfaceFormat(aQStack_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QPlatformOpenGLContext *)pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

QPlatformOpenGLContext *QXcbEglIntegration::createPlatformOpenGLContext(QOpenGLContext *context) const
{
    QXcbScreen *screen = static_cast<QXcbScreen *>(context->screen()->handle());
    QXcbEglContext *platformContext = new QXcbEglContext(screen->surfaceFormatFor(context->format()),
                                                         context->shareHandle(),
                                                         eglDisplay());
    return platformContext;
}